

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.cc
# Opt level: O3

t_object * __thiscall xemmai::t_tuple::f_string(t_tuple *this)

{
  char *pcVar1;
  undefined8 *puVar2;
  t_object *ptVar3;
  undefined8 extraout_RAX;
  ulong uVar4;
  size_t sVar5;
  wchar_t *a_p;
  t_tuple *ptVar6;
  long in_FS_OFFSET;
  wstring_view a_s;
  t_stringer local_50;
  t_tuple *local_38;
  
  local_50.v_p = *(t_object **)(*(long *)(in_FS_OFFSET + -0x78) + 0x2e8);
  local_50.v_i = (wchar_t *)((local_50.v_p)->v_data + 8);
  local_50.v_j = local_50.v_i;
  t_stringer::f_grow(&local_50);
  pcVar1 = (char *)((long)local_50.v_i + 4);
  *local_50.v_i = 0x27;
  local_50.v_i = (wchar_t *)pcVar1;
  if ((wchar_t *)pcVar1 == local_50.v_j) {
    t_stringer::f_grow(&local_50);
  }
  pcVar1 = (char *)((long)local_50.v_i + 4);
  *(char *)((long)local_50.v_i + 0) = '(';
  *(char *)((long)local_50.v_i + 1) = '\0';
  *(char *)((long)local_50.v_i + 2) = '\0';
  *(char *)((long)local_50.v_i + 3) = '\0';
  local_50.v_i = (wchar_t *)pcVar1;
  if (this->v_size == 0) {
LAB_0015d062:
    if (local_50.v_i == local_50.v_j) {
      t_stringer::f_grow(&local_50);
    }
    *(char *)((long)local_50.v_i + 0) = ')';
    *(char *)((long)local_50.v_i + 1) = '\0';
    *(char *)((long)local_50.v_i + 2) = '\0';
    *(char *)((long)local_50.v_i + 3) = '\0';
    *(char *)((long)local_50.v_i + 4) = '\0';
    *(char *)((long)local_50.v_i + 5) = '\0';
    *(char *)((long)local_50.v_i + 6) = '\0';
    *(char *)((long)local_50.v_i + 7) = '\0';
    *(long *)(local_50.v_p)->v_data = (long)((long)local_50.v_i + (-0x4c - (long)local_50.v_p)) >> 2
    ;
    return local_50.v_p;
  }
  ptVar6 = this + 1;
  uVar4 = 1;
  local_38 = this;
  do {
    sVar5 = ptVar6->v_size;
    switch(sVar5) {
    case 0:
      sVar5 = 4;
      a_p = L"null";
      goto LAB_0015cf65;
    case 1:
    case 2:
      sVar5 = (ulong)(ptVar6->v_size < 2) + 4;
      a_p = L"false";
      if (1 < ptVar6->v_size) {
        a_p = L"true";
      }
LAB_0015cf65:
      ptVar3 = t_string::f_instantiate(a_p,sVar5);
      break;
    case 3:
      ptVar3 = t_type_of<long>::f__string(ptVar6[1].v_size);
      break;
    case 4:
      ptVar3 = t_type_of<double>::f__string((double)ptVar6[1].v_size);
      break;
    default:
      puVar2 = *(undefined8 **)(in_FS_OFFSET + -0x30);
      *(undefined8 **)(in_FS_OFFSET + -0x30) = puVar2 + 4;
      (**(code **)(*(long *)(sVar5 + 0x40) + 0xc0))(sVar5,puVar2);
      ptVar3 = (t_object *)*puVar2;
      *(undefined8 **)(in_FS_OFFSET + -0x30) = puVar2;
      this = local_38;
    }
    if (((ptVar3 < (t_object *)0x5) || (ptVar3->v_type->v_depth == 0)) ||
       ((undefined8 *)ptVar3->v_type->v_ids[1] != &v__type_id<xemmai::t_string>)) {
      f_string();
      *(undefined8 **)(in_FS_OFFSET + -0x30) = &v__type_id<xemmai::t_string>;
      _Unwind_Resume(extraout_RAX);
    }
    a_s._M_str = ptVar3->v_data + 8;
    a_s._M_len = *(size_t *)ptVar3->v_data;
    t_stringer::operator<<(&local_50,a_s);
    if (this->v_size <= uVar4) goto LAB_0015d062;
    if (local_50.v_i == local_50.v_j) {
      t_stringer::f_grow(&local_50);
    }
    pcVar1 = (char *)((long)local_50.v_i + 4);
    *(char *)((long)local_50.v_i + 0) = ',';
    *(char *)((long)local_50.v_i + 1) = '\0';
    *(char *)((long)local_50.v_i + 2) = '\0';
    *(char *)((long)local_50.v_i + 3) = '\0';
    local_50.v_i = (wchar_t *)pcVar1;
    if ((wchar_t *)pcVar1 == local_50.v_j) {
      t_stringer::f_grow(&local_50);
    }
    *(char *)((long)local_50.v_i + 0) = ' ';
    *(char *)((long)local_50.v_i + 1) = '\0';
    *(char *)((long)local_50.v_i + 2) = '\0';
    *(char *)((long)local_50.v_i + 3) = '\0';
    ptVar6 = ptVar6 + 2;
    uVar4 = uVar4 + 1;
    local_50.v_i = (wchar_t *)((long)local_50.v_i + 4);
  } while( true );
}

Assistant:

t_object* t_tuple::f_string() const
{
	t_stringer s;
	s << L'\'' << L'(';
	if (v_size > 0) for (size_t i = 0;;) {
		auto x = (*this)[i].f_string();
		f_check<t_string>(x, L"value");
		s << x->f_as<t_string>();
		if (++i >= v_size) break;
		s << L',' << L' ';
	}
	return s << L')';
}